

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pDistinct,u16 wctrlFlags,int iIdxCur)

{
  Vdbe *p;
  Index *pIVar1;
  Table *pTab_00;
  int iVar2;
  int iVar3;
  u8 *pMaskSet_00;
  Bitmask BVar4;
  SrcList_item *pSrc;
  VTable *zP4;
  KeyInfo *zP4_00;
  WhereLevel *pLevel_00;
  SrcList_item *local_1b8;
  int local_1a8;
  int iIndexCur;
  KeyInfo *pKey;
  Index *pIx;
  Bitmask BStack_188;
  int n;
  Bitmask b;
  int op;
  int iCur;
  char *pVTab;
  SrcList_item *pTabItem;
  int iDb;
  Table *pTab;
  Bitmask notIndexed;
  int local_148;
  int nUnconstrained;
  int ckOptimal;
  int isOptimal;
  Bitmask m;
  int bestJ;
  int j;
  Index *pIdx;
  WhereCost bestPlan;
  sqlite3 *db;
  uint local_f0;
  int ii;
  int andFlags;
  int iFrom;
  WhereLevel *pLevel;
  WhereMaskSet *pMaskSet;
  WhereBestIdx sWBI;
  Bitmask notReady;
  Vdbe *v;
  WhereInfo *pWInfo;
  int nTabList;
  int nByteWInfo;
  u16 wctrlFlags_local;
  ExprList *pDistinct_local;
  ExprList *pOrderBy_local;
  Expr *pWhere_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  memset(&pMaskSet,0,0x78);
  pMaskSet = (WhereMaskSet *)pParse;
  if (pTabList->nSrc < 0x41) {
    if ((wctrlFlags & 0x40) == 0) {
      local_1a8 = (int)pTabList->nSrc;
    }
    else {
      local_1a8 = 1;
    }
    bestPlan.used = (Bitmask)pParse->db;
    iVar3 = (local_1a8 + -1) * 0x60;
    v = (Vdbe *)sqlite3DbMallocZero((sqlite3 *)bestPlan.used,iVar3 + 0x394);
    if (*(char *)(bestPlan.used + 0x50) == '\0') {
      *(int *)((long)&v->aColName + 4) = local_1a8;
      v->db = (sqlite3 *)pParse;
      v->aOp = (Op *)pTabList;
      iVar2 = sqlite3VdbeMakeLabel(p);
      *(int *)&v->aColName = iVar2;
      sWBI.pParse = (Parse *)((long)&v->db + (long)(iVar3 + 0xa0));
      v->pResultSet = (Mem *)sWBI.pParse;
      *(u16 *)((long)&v->aMem + 2) = wctrlFlags;
      *(double *)&v->nMem = pParse->nQueryLoop;
      pMaskSet_00 = &(sWBI.pParse)->eTriggerOp;
      sWBI._64_8_ = &v->aLabel;
      _nByteWInfo = pDistinct;
      if ((*(ushort *)(bestPlan.used + 0x4c) & 0x20) != 0) {
        _nByteWInfo = (ExprList *)0x0;
      }
      memset(pMaskSet_00,0,0x104);
      whereClauseInit((WhereClause *)sWBI.pParse,pParse,(WhereMaskSet *)pMaskSet_00,wctrlFlags);
      sqlite3ExprCodeConstants(pParse,pWhere);
      whereSplit((WhereClause *)sWBI.pParse,pWhere,0x45);
      if ((pWhere != (Expr *)0x0) &&
         ((local_1a8 == 0 || (iVar3 = sqlite3ExprIsConstantNotJoin(pWhere), iVar3 != 0)))) {
        sqlite3ExprIfFalse(pParse,pWhere,*(int *)&v->aColName,8);
      }
      for (db._4_4_ = 0; db._4_4_ < pTabList->nSrc; db._4_4_ = db._4_4_ + 1) {
        createMask((WhereMaskSet *)pMaskSet_00,pTabList->a[db._4_4_].iCursor);
      }
      exprAnalyzeAll(pTabList,(WhereClause *)sWBI.pParse);
      if (*(char *)(bestPlan.used + 0x50) == '\0') {
        if ((_nByteWInfo != (ExprList *)0x0) &&
           (iVar3 = isDistinctRedundant(pParse,pTabList,(WhereClause *)sWBI.pParse,_nByteWInfo),
           iVar3 != 0)) {
          _nByteWInfo = (ExprList *)0x0;
          *(u8 *)((long)&v->aMem + 6) = '\x01';
        }
        sWBI.notReady = 0xffffffffffffffff;
        sWBI.ppIdxInfo._4_4_ = local_1a8;
        sWBI.pOrderBy = _nByteWInfo;
        local_f0 = 0xffffffff;
        ii = 0;
        _andFlags = (WhereLevel *)&v->aLabel;
        sWBI.notValid = (Bitmask)pOrderBy;
        for (sWBI.ppIdxInfo._0_4_ = 0; (int)sWBI.ppIdxInfo < local_1a8;
            sWBI.ppIdxInfo._0_4_ = (int)sWBI.ppIdxInfo + 1) {
          m._0_4_ = -1;
          memset(&pIdx,0,0x28);
          bestPlan.plan.u.pIdx = (Index *)0x547d42aea2879f2e;
          notIndexed._4_4_ = 0;
          if (ii == local_1a8 + -1) {
            local_148 = 0;
          }
          else {
            local_148 = -1;
            sWBI.pWC = (WhereClause *)(pTabList->a + ii);
            for (m._4_4_ = ii; m._4_4_ < local_1a8; m._4_4_ = m._4_4_ + 1) {
              BVar4 = getMask((WhereMaskSet *)pMaskSet_00,(sWBI.pWC)->aStatic[0].leftCursor);
              if ((BVar4 & sWBI.notReady) == 0) {
                if (m._4_4_ == ii) {
                  ii = ii + 1;
                }
              }
              else if ((((ii < m._4_4_) && (((sWBI.pWC)->aStatic[0].iParent & 10) != 0)) ||
                       (local_148 = local_148 + 1, local_148 != 0)) ||
                      (((sWBI.pWC)->aStatic[0].iParent & 8) != 0)) break;
              sWBI.pWC = (WhereClause *)((sWBI.pWC)->aStatic + 1);
            }
          }
          for (nUnconstrained = local_148; -1 < nUnconstrained && (int)m < 0;
              nUnconstrained = nUnconstrained + -1) {
            m._4_4_ = ii;
            sWBI.pWC = (WhereClause *)(pTabList->a + ii);
            while ((m._4_4_ < local_1a8 &&
                   ((m._4_4_ <= ii || (((sWBI.pWC)->aStatic[0].iParent & 10) == 0))))) {
              local_1b8 = (SrcList_item *)
                          getMask((WhereMaskSet *)pMaskSet_00,(sWBI.pWC)->aStatic[0].leftCursor);
              if (((ulong)local_1b8 & sWBI.notReady) != 0) {
                if (nUnconstrained == 0) {
                  local_1b8 = (SrcList_item *)sWBI.notReady;
                }
                sWBI.pSrc = local_1b8;
                if ((sWBI.pWC)->aStatic[0].prereqAll == 0) {
                  notIndexed._4_4_ = notIndexed._4_4_ + 1;
                }
                if ((*(byte *)(*(long *)&(sWBI.pWC)->nSlot + 0x46) & 0x10) == 0) {
                  bestBtreeIndex((WhereBestIdx *)&pMaskSet);
                }
                else {
                  sWBI.pDistinct =
                       (ExprList *)(v->aCounter + (long)m._4_4_ * 0x18U + 0xfffffffffffffffb);
                  bestVirtualIndex((WhereBestIdx *)&pMaskSet);
                }
                if (nUnconstrained == 0) {
                  if (local_148 != 0) {
                    sWBI.cost.plan.u.pIdx =
                         (Index *)(sWBI.cost.plan.u.pIdx /
                                  *(double *)
                                   (v->aCounter + (long)m._4_4_ * 0x18U + 0xfffffffffffffff9));
                  }
                }
                else {
                  *(anon_union_8_3_b4c78fbb_for_u *)
                   (v->aCounter + (long)m._4_4_ * 0x18U + 0xfffffffffffffff9) = sWBI.cost.plan.u;
                }
                if ((((ulong)sWBI.cost.rCost & sWBI.notReady) == 0) &&
                   ((((notIndexed._4_4_ == 0 || ((sWBI.pWC)->aStatic[0].prereqAll == 0)) ||
                     (((uint)sWBI.aLevel & 0x100f3000) != 0)) &&
                    (((int)m < 0 ||
                     (iVar3 = compareCost((WhereCost *)&sWBI.aLevel,(WhereCost *)&pIdx), iVar3 != 0)
                     ))))) {
                  memcpy(&pIdx,&sWBI.aLevel,0x28);
                  m._0_4_ = m._4_4_;
                }
                if (((sWBI.pWC)->aStatic[0].iParent & 8) != 0) break;
              }
              m._4_4_ = m._4_4_ + 1;
              sWBI.pWC = (WhereClause *)((sWBI.pWC)->aStatic + 1);
            }
          }
          if (((uint)pIdx & 0x40000000) != 0) {
            *(u8 *)((long)&v->aMem + 6) = '\x02';
          }
          local_f0 = (uint)pIdx & local_f0;
          (_andFlags->plan).wsFlags = (uint)pIdx;
          (_andFlags->plan).nEq = (short)pIdx._4_4_;
          (_andFlags->plan).nOBSat = (short)((uint)pIdx._4_4_ >> 0x10);
          (_andFlags->plan).nRow = (double)bestPlan.plan._0_8_;
          (_andFlags->plan).u = (anon_union_8_3_b4c78fbb_for_u)bestPlan.plan.nRow;
          _andFlags->iTabCur = pTabList->a[(int)m].iCursor;
          if (((uint)pIdx & 0x200f0000) == 0) {
            _andFlags->iIdxCur = -1;
          }
          else if (((wctrlFlags & 0x40) == 0) || (((uint)pIdx & 0x20000000) != 0)) {
            iVar3 = pParse->nTab;
            pParse->nTab = iVar3 + 1;
            _andFlags->iIdxCur = iVar3;
          }
          else {
            _andFlags->iIdxCur = iIdxCur;
          }
          BVar4 = getMask((WhereMaskSet *)pMaskSet_00,pTabList->a[(int)m].iCursor);
          sWBI.notReady = (BVar4 ^ 0xffffffffffffffff) & sWBI.notReady;
          _andFlags->iFrom = (u8)(int)m;
          if (1.0 <= (double)bestPlan.plan._0_8_) {
            pParse->nQueryLoop = (double)bestPlan.plan._0_8_ * pParse->nQueryLoop;
          }
          pIVar1 = pTabList->a[(int)m].pIndex;
          if ((pIVar1 != (Index *)0x0) && (((uint)pIdx & 0xf0000) == 0)) {
            sqlite3ErrorMsg(pParse,"cannot use index: %s",pIVar1->zName);
            goto LAB_001d0ade;
          }
          _andFlags = _andFlags + 1;
        }
        if ((pParse->nErr == 0) && (*(char *)(bestPlan.used + 0x50) == '\0')) {
          if (local_1a8 == 0) {
            *(u16 *)&v->aMem = 0;
          }
          else {
            *(u16 *)&v->aMem = *(u16 *)((long)(_andFlags + -1) + 6);
          }
          if (((local_f0 & 0x2000000) != 0) && (pOrderBy != (ExprList *)0x0)) {
            *(u16 *)&v->aMem = (u16)pOrderBy->nExpr;
          }
          if (((wctrlFlags & 4) != 0) && ((local_f0 & 0x2000000) != 0)) {
            *(u8 *)((long)&v->aMem + 4) = '\x01';
            (((WhereLevel *)&v->aLabel)->plan).wsFlags =
                 (((WhereLevel *)&v->aLabel)->plan).wsFlags & 0xffbfffff;
          }
          sqlite3CodeVerifySchema(pParse,-1);
          sWBI.cost.used = 0xffffffffffffffff;
          *(double *)&v->nOpAlloc = 1.0;
          _andFlags = (WhereLevel *)&v->aLabel;
          for (db._4_4_ = 0; db._4_4_ < local_1a8; db._4_4_ = db._4_4_ + 1) {
            pSrc = pTabList->a + _andFlags->iFrom;
            pTab_00 = pSrc->pTab;
            *(double *)&v->nOpAlloc = (_andFlags->plan).nRow * *(double *)&v->nOpAlloc;
            iVar3 = sqlite3SchemaToIndex((sqlite3 *)bestPlan.used,pTab_00->pSchema);
            if (((pTab_00->tabFlags & 2) == 0) && (pTab_00->pSelect == (Select *)0x0)) {
              if (((_andFlags->plan).wsFlags & 0x8000000) == 0) {
                if ((pTab_00->tabFlags & 0x10) == 0) {
                  if ((((_andFlags->plan).wsFlags & 0x400000) == 0) && ((wctrlFlags & 0x10) == 0)) {
                    iVar2 = 0x27;
                    if (*(u8 *)((long)&v->aMem + 4) != '\0') {
                      iVar2 = 0x28;
                    }
                    sqlite3OpenTable(pParse,pSrc->iCursor,iVar3,pTab_00,iVar2);
                    if ((*(u8 *)((long)&v->aMem + 4) == '\0') && (pTab_00->nCol < 0x40)) {
                      BStack_188 = pSrc->colUsed;
                      pIx._4_4_ = 0;
                      for (; BStack_188 != 0; BStack_188 = BStack_188 >> 1) {
                        pIx._4_4_ = pIx._4_4_ + 1;
                      }
                      iVar2 = sqlite3VdbeCurrentAddr(p);
                      sqlite3VdbeChangeP4(p,iVar2 + -1,(char *)(long)pIx._4_4_,-0xe);
                    }
                  }
                  else {
                    sqlite3TableLock(pParse,iVar3,pTab_00->tnum,'\0',pTab_00->zName);
                  }
                }
              }
              else {
                zP4 = sqlite3GetVTable((sqlite3 *)bestPlan.used,pTab_00);
                sqlite3VdbeAddOp4(p,0x87,pSrc->iCursor,0,0,(char *)zP4,-10);
              }
            }
            if (((_andFlags->plan).wsFlags & 0x20000000) == 0) {
              if (((_andFlags->plan).wsFlags & 0xf0000) != 0) {
                pIVar1 = (_andFlags->plan).u.pIdx;
                zP4_00 = sqlite3IndexKeyinfo(pParse,pIVar1);
                sqlite3VdbeAddOp4(p,0x27,_andFlags->iIdxCur,pIVar1->tnum,iVar3,(char *)zP4_00,-0x10)
                ;
              }
            }
            else {
              constructAutomaticIndex
                        (pParse,(WhereClause *)sWBI.pParse,pSrc,sWBI.cost.used,_andFlags);
            }
            sqlite3CodeVerifySchema(pParse,iVar3);
            BVar4 = getMask((WhereMaskSet *)(sWBI.pParse)->zErrMsg,pSrc->iCursor);
            sWBI.cost.used = (BVar4 ^ 0xffffffffffffffff) & sWBI.cost.used;
            _andFlags = _andFlags + 1;
          }
          iVar3 = sqlite3VdbeCurrentAddr(p);
          *(int *)&v->apArg = iVar3;
          if (*(char *)(bestPlan.used + 0x50) == '\0') {
            sWBI.cost.used = 0xffffffffffffffff;
            for (db._4_4_ = 0; db._4_4_ < local_1a8; db._4_4_ = db._4_4_ + 1) {
              pLevel_00 = (WhereLevel *)(&v->pResultSet + (long)db._4_4_ * 0xc + 3);
              explainOneScan(pParse,pTabList,pLevel_00,db._4_4_,(uint)pLevel_00->iFrom,wctrlFlags);
              sWBI.cost.used = codeOneLoopStart((WhereInfo *)v,db._4_4_,wctrlFlags,sWBI.cost.used);
              *(int *)((long)&v->apArg + 4) = pLevel_00->addrCont;
            }
            return (WhereInfo *)v;
          }
        }
      }
    }
    else {
      sqlite3DbFree((sqlite3 *)bestPlan.used,v);
      v = (Vdbe *)0x0;
    }
LAB_001d0ade:
    if (v != (Vdbe *)0x0) {
      pParse->nQueryLoop = *(double *)&v->nMem;
      whereInfoFree((sqlite3 *)bestPlan.used,(WhereInfo *)v);
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
  }
  return (WhereInfo *)0x0;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,        /* The parser context */
  SrcList *pTabList,    /* A list of all tables to be scanned */
  Expr *pWhere,         /* The WHERE clause */
  ExprList *pOrderBy,   /* An ORDER BY clause, or NULL */
  ExprList *pDistinct,  /* The select-list for DISTINCT queries - or NULL */
  u16 wctrlFlags,       /* One of the WHERE_* flags defined in sqliteInt.h */
  int iIdxCur           /* If WHERE_ONETABLE_ONLY is set, index cursor number */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereBestIdx sWBI;         /* Best index search context */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  int iFrom;                 /* First unused FROM clause element */
  int andFlags;              /* AND-ed combination of all pWC->a[].wtFlags */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */


  /* Variable initialization */
  memset(&sWBI, 0, sizeof(sWBI));
  sWBI.pParse = pParse;

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_ONETABLE_ONLY flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_ONETABLE_ONLY) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  db = pParse->db;
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocZero(db, 
      nByteWInfo + 
      sizeof(WhereClause) +
      sizeof(WhereMaskSet)
  );
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->nLevel = nTabList;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->iBreak = sqlite3VdbeMakeLabel(v);
  pWInfo->pWC = sWBI.pWC = (WhereClause *)&((u8 *)pWInfo)[nByteWInfo];
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pMaskSet = (WhereMaskSet*)&sWBI.pWC[1];
  sWBI.aLevel = pWInfo->a;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ) pDistinct = 0;

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  whereClauseInit(sWBI.pWC, pParse, pMaskSet, wctrlFlags);
  sqlite3ExprCodeConstants(pParse, pWhere);
  whereSplit(sWBI.pWC, pWhere, TK_AND);   /* IMP: R-15842-53296 */
    
  /* Special case: a WHERE clause that is constant.  Evaluate the
  ** expression and either jump over all of the code or fall thru.
  */
  if( pWhere && (nTabList==0 || sqlite3ExprIsConstantNotJoin(pWhere)) ){
    sqlite3ExprIfFalse(pParse, pWhere, pWInfo->iBreak, SQLITE_JUMPIFNULL);
    pWhere = 0;
  }

  /* Assign a bit from the bitmask to every term in the FROM clause.
  **
  ** When assigning bitmask values to FROM clause cursors, it must be
  ** the case that if X is the bitmask for the N-th FROM clause term then
  ** the bitmask for all FROM clause terms to the left of the N-th term
  ** is (X-1).   An expression from the ON clause of a LEFT JOIN can use
  ** its Expr.iRightJoinTable value to find the bitmask of the right table
  ** of the join.  Subtracting one from the right table bitmask gives a
  ** bitmask for all tables to the left of the join.  Knowing the bitmask
  ** for all tables to the left of a left join is important.  Ticket #3015.
  **
  ** Note that bitmasks are created for all pTabList->nSrc tables in
  ** pTabList, not just the first nTabList tables.  nTabList is normally
  ** equal to pTabList->nSrc but might be shortened to 1 if the
  ** WHERE_ONETABLE_ONLY flag is set.
  */
  for(ii=0; ii<pTabList->nSrc; ii++){
    createMask(pMaskSet, pTabList->a[ii].iCursor);
  }
#ifndef NDEBUG
  {
    Bitmask toTheLeft = 0;
    for(ii=0; ii<pTabList->nSrc; ii++){
      Bitmask m = getMask(pMaskSet, pTabList->a[ii].iCursor);
      assert( (m-1)==toTheLeft );
      toTheLeft |= m;
    }
  }
#endif

  /* Analyze all of the subexpressions.  Note that exprAnalyze() might
  ** add new virtual terms onto the end of the WHERE clause.  We do not
  ** want to analyze these virtual terms, so start analyzing at the end
  ** and work forward so that the added virtual terms are never processed.
  */
  exprAnalyzeAll(pTabList, sWBI.pWC);
  if( db->mallocFailed ){
    goto whereBeginError;
  }

  /* Check if the DISTINCT qualifier, if there is one, is redundant. 
  ** If it is, then set pDistinct to NULL and WhereInfo.eDistinct to
  ** WHERE_DISTINCT_UNIQUE to tell the caller to ignore the DISTINCT.
  */
  if( pDistinct && isDistinctRedundant(pParse, pTabList, sWBI.pWC, pDistinct) ){
    pDistinct = 0;
    pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
  }

  /* Chose the best index to use for each table in the FROM clause.
  **
  ** This loop fills in the following fields:
  **
  **   pWInfo->a[].pIdx      The index to use for this level of the loop.
  **   pWInfo->a[].wsFlags   WHERE_xxx flags associated with pIdx
  **   pWInfo->a[].nEq       The number of == and IN constraints
  **   pWInfo->a[].iFrom     Which term of the FROM clause is being coded
  **   pWInfo->a[].iTabCur   The VDBE cursor for the database table
  **   pWInfo->a[].iIdxCur   The VDBE cursor for the index
  **   pWInfo->a[].pTerm     When wsFlags==WO_OR, the OR-clause term
  **
  ** This loop also figures out the nesting order of tables in the FROM
  ** clause.
  */
  sWBI.notValid = ~(Bitmask)0;
  sWBI.pOrderBy = pOrderBy;
  sWBI.n = nTabList;
  sWBI.pDistinct = pDistinct;
  andFlags = ~0;
  WHERETRACE(("*** Optimizer Start ***\n"));
  for(sWBI.i=iFrom=0, pLevel=pWInfo->a; sWBI.i<nTabList; sWBI.i++, pLevel++){
    WhereCost bestPlan;         /* Most efficient plan seen so far */
    Index *pIdx;                /* Index for FROM table at pTabItem */
    int j;                      /* For looping over FROM tables */
    int bestJ = -1;             /* The value of j */
    Bitmask m;                  /* Bitmask value for j or bestJ */
    int isOptimal;              /* Iterator for optimal/non-optimal search */
    int ckOptimal;              /* Do the optimal scan check */
    int nUnconstrained;         /* Number tables without INDEXED BY */
    Bitmask notIndexed;         /* Mask of tables that cannot use an index */

    memset(&bestPlan, 0, sizeof(bestPlan));
    bestPlan.rCost = SQLITE_BIG_DBL;
    WHERETRACE(("*** Begin search for loop %d ***\n", sWBI.i));

    /* Loop through the remaining entries in the FROM clause to find the
    ** next nested loop. The loop tests all FROM clause entries
    ** either once or twice. 
    **
    ** The first test is always performed if there are two or more entries
    ** remaining and never performed if there is only one FROM clause entry
    ** to choose from.  The first test looks for an "optimal" scan.  In
    ** this context an optimal scan is one that uses the same strategy
    ** for the given FROM clause entry as would be selected if the entry
    ** were used as the innermost nested loop.  In other words, a table
    ** is chosen such that the cost of running that table cannot be reduced
    ** by waiting for other tables to run first.  This "optimal" test works
    ** by first assuming that the FROM clause is on the inner loop and finding
    ** its query plan, then checking to see if that query plan uses any
    ** other FROM clause terms that are sWBI.notValid.  If no notValid terms
    ** are used then the "optimal" query plan works.
    **
    ** Note that the WhereCost.nRow parameter for an optimal scan might
    ** not be as small as it would be if the table really were the innermost
    ** join.  The nRow value can be reduced by WHERE clause constraints
    ** that do not use indices.  But this nRow reduction only happens if the
    ** table really is the innermost join.  
    **
    ** The second loop iteration is only performed if no optimal scan
    ** strategies were found by the first iteration. This second iteration
    ** is used to search for the lowest cost scan overall.
    **
    ** Without the optimal scan step (the first iteration) a suboptimal
    ** plan might be chosen for queries like this:
    **   
    **   CREATE TABLE t1(a, b); 
    **   CREATE TABLE t2(c, d);
    **   SELECT * FROM t2, t1 WHERE t2.rowid = t1.a;
    **
    ** The best strategy is to iterate through table t1 first. However it
    ** is not possible to determine this with a simple greedy algorithm.
    ** Since the cost of a linear scan through table t2 is the same 
    ** as the cost of a linear scan through table t1, a simple greedy 
    ** algorithm may choose to use t2 for the outer loop, which is a much
    ** costlier approach.
    */
    nUnconstrained = 0;
    notIndexed = 0;

    /* The optimal scan check only occurs if there are two or more tables
    ** available to be reordered */
    if( iFrom==nTabList-1 ){
      ckOptimal = 0;  /* Common case of just one table in the FROM clause */
    }else{
      ckOptimal = -1;
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          if( j==iFrom ) iFrom++;
          continue;
        }
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ) break;
        if( ++ckOptimal ) break;
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( ckOptimal==0 || ckOptimal==1 );

    for(isOptimal=ckOptimal; isOptimal>=0 && bestJ<0; isOptimal--){
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ){
          /* This break and one like it in the ckOptimal computation loop
          ** above prevent table reordering across LEFT and CROSS JOINs.
          ** The LEFT JOIN case is necessary for correctness.  The prohibition
          ** against reordering across a CROSS JOIN is an SQLite feature that
          ** allows the developer to control table reordering */
          break;
        }
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          assert( j>iFrom );
          continue;
        }
        sWBI.notReady = (isOptimal ? m : sWBI.notValid);
        if( sWBI.pSrc->pIndex==0 ) nUnconstrained++;
  
        WHERETRACE(("   === trying table %d (%s) with isOptimal=%d ===\n",
                    j, sWBI.pSrc->pTab->zName, isOptimal));
        assert( sWBI.pSrc->pTab );
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(sWBI.pSrc->pTab) ){
          sWBI.ppIdxInfo = &pWInfo->a[j].pIdxInfo;
          bestVirtualIndex(&sWBI);
        }else 
#endif
        {
          bestBtreeIndex(&sWBI);
        }
        assert( isOptimal || (sWBI.cost.used&sWBI.notValid)==0 );

        /* If an INDEXED BY clause is present, then the plan must use that
        ** index if it uses any index at all */
        assert( sWBI.pSrc->pIndex==0 
                  || (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0
                  || sWBI.cost.plan.u.pIdx==sWBI.pSrc->pIndex );

        if( isOptimal && (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0 ){
          notIndexed |= m;
        }
        if( isOptimal ){
          pWInfo->a[j].rOptCost = sWBI.cost.rCost;
        }else if( ckOptimal ){
          /* If two or more tables have nearly the same outer loop cost, but
          ** very different inner loop (optimal) cost, we want to choose
          ** for the outer loop that table which benefits the least from
          ** being in the inner loop.  The following code scales the 
          ** outer loop cost estimate to accomplish that. */
          WHERETRACE(("   scaling cost from %.1f to %.1f\n",
                      sWBI.cost.rCost,
                      sWBI.cost.rCost/pWInfo->a[j].rOptCost));
          sWBI.cost.rCost /= pWInfo->a[j].rOptCost;
        }

        /* Conditions under which this table becomes the best so far:
        **
        **   (1) The table must not depend on other tables that have not
        **       yet run.  (In other words, it must not depend on tables
        **       in inner loops.)
        **
        **   (2) (This rule was removed on 2012-11-09.  The scaling of the
        **       cost using the optimal scan cost made this rule obsolete.)
        **
        **   (3) All tables have an INDEXED BY clause or this table lacks an
        **       INDEXED BY clause or this table uses the specific
        **       index specified by its INDEXED BY clause.  This rule ensures
        **       that a best-so-far is always selected even if an impossible
        **       combination of INDEXED BY clauses are given.  The error
        **       will be detected and relayed back to the application later.
        **       The NEVER() comes about because rule (2) above prevents
        **       An indexable full-table-scan from reaching rule (3).
        **
        **   (4) The plan cost must be lower than prior plans, where "cost"
        **       is defined by the compareCost() function above. 
        */
        if( (sWBI.cost.used&sWBI.notValid)==0                    /* (1) */
            && (nUnconstrained==0 || sWBI.pSrc->pIndex==0        /* (3) */
                || NEVER((sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)!=0))
            && (bestJ<0 || compareCost(&sWBI.cost, &bestPlan))   /* (4) */
        ){
          WHERETRACE(("   === table %d (%s) is best so far\n"
                      "       cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=%08x\n",
                      j, sWBI.pSrc->pTab->zName,
                      sWBI.cost.rCost, sWBI.cost.plan.nRow,
                      sWBI.cost.plan.nOBSat, sWBI.cost.plan.wsFlags));
          bestPlan = sWBI.cost;
          bestJ = j;
        }

        /* In a join like "w JOIN x LEFT JOIN y JOIN z"  make sure that
        ** table y (and not table z) is always the next inner loop inside
        ** of table x. */
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( bestJ>=0 );
    assert( sWBI.notValid & getMask(pMaskSet, pTabList->a[bestJ].iCursor) );
    assert( bestJ==iFrom || (pTabList->a[iFrom].jointype & JT_LEFT)==0 );
    testcase( bestJ>iFrom && (pTabList->a[iFrom].jointype & JT_CROSS)!=0 );
    testcase( bestJ>iFrom && bestJ<nTabList-1
                          && (pTabList->a[bestJ+1].jointype & JT_LEFT)!=0 );
    WHERETRACE(("*** Optimizer selects table %d (%s) for loop %d with:\n"
                "    cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=0x%08x\n",
                bestJ, pTabList->a[bestJ].pTab->zName,
                pLevel-pWInfo->a, bestPlan.rCost, bestPlan.plan.nRow,
                bestPlan.plan.nOBSat, bestPlan.plan.wsFlags));
    if( (bestPlan.plan.wsFlags & WHERE_DISTINCT)!=0 ){
      assert( pWInfo->eDistinct==0 );
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
    andFlags &= bestPlan.plan.wsFlags;
    pLevel->plan = bestPlan.plan;
    pLevel->iTabCur = pTabList->a[bestJ].iCursor;
    testcase( bestPlan.plan.wsFlags & WHERE_INDEXED );
    testcase( bestPlan.plan.wsFlags & WHERE_TEMP_INDEX );
    if( bestPlan.plan.wsFlags & (WHERE_INDEXED|WHERE_TEMP_INDEX) ){
      if( (wctrlFlags & WHERE_ONETABLE_ONLY) 
       && (bestPlan.plan.wsFlags & WHERE_TEMP_INDEX)==0 
      ){
        pLevel->iIdxCur = iIdxCur;
      }else{
        pLevel->iIdxCur = pParse->nTab++;
      }
    }else{
      pLevel->iIdxCur = -1;
    }
    sWBI.notValid &= ~getMask(pMaskSet, pTabList->a[bestJ].iCursor);
    pLevel->iFrom = (u8)bestJ;
    if( bestPlan.plan.nRow>=(double)1 ){
      pParse->nQueryLoop *= bestPlan.plan.nRow;
    }

    /* Check that if the table scanned by this loop iteration had an
    ** INDEXED BY clause attached to it, that the named index is being
    ** used for the scan. If not, then query compilation has failed.
    ** Return an error.
    */
    pIdx = pTabList->a[bestJ].pIndex;
    if( pIdx ){
      if( (bestPlan.plan.wsFlags & WHERE_INDEXED)==0 ){
        sqlite3ErrorMsg(pParse, "cannot use index: %s", pIdx->zName);
        goto whereBeginError;
      }else{
        /* If an INDEXED BY clause is used, the bestIndex() function is
        ** guaranteed to find the index specified in the INDEXED BY clause
        ** if it find an index at all. */
        assert( bestPlan.plan.u.pIdx==pIdx );
      }
    }
  }
  WHERETRACE(("*** Optimizer Finished ***\n"));
  if( pParse->nErr || db->mallocFailed ){
    goto whereBeginError;
  }
  if( nTabList ){
    pLevel--;
    pWInfo->nOBSat = pLevel->plan.nOBSat;
  }else{
    pWInfo->nOBSat = 0;
  }

  /* If the total query only selects a single row, then the ORDER BY
  ** clause is irrelevant.
  */
  if( (andFlags & WHERE_UNIQUE)!=0 && pOrderBy ){
    assert( nTabList==0 || (pLevel->plan.wsFlags & WHERE_ALL_UNIQUE)!=0 );
    pWInfo->nOBSat = pOrderBy->nExpr;
  }

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  ** The one-pass algorithm only works if the WHERE clause constraints
  ** the statement to update a single row.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 && (andFlags & WHERE_UNIQUE)!=0 ){
    pWInfo->okOnePass = 1;
    pWInfo->a[0].plan.wsFlags &= ~WHERE_IDX_ONLY;
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  sqlite3CodeVerifySchema(pParse, -1); /* Insert the cookie verifier Goto */
  notReady = ~(Bitmask)0;
  pWInfo->nRowOut = (double)1;
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    pWInfo->nRowOut *= pLevel->plan.nRow;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLevel->plan.wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0 ){
      int op = pWInfo->okOnePass ? OP_OpenWrite : OP_OpenRead;
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      testcase( pTab->nCol==BMS-1 );
      testcase( pTab->nCol==BMS );
      if( !pWInfo->okOnePass && pTab->nCol<BMS ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, sqlite3VdbeCurrentAddr(v)-1, 
                            SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->plan.wsFlags & WHERE_TEMP_INDEX)!=0 ){
      constructAutomaticIndex(pParse, sWBI.pWC, pTabItem, notReady, pLevel);
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 ){
      Index *pIx = pLevel->plan.u.pIdx;
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIx);
      int iIndexCur = pLevel->iIdxCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      sqlite3VdbeAddOp4(v, OP_OpenRead, iIndexCur, pIx->tnum, iDb,
                        (char*)pKey, P4_KEYINFO_HANDOFF);
      VdbeComment((v, "%s", pIx->zName));
    }
    sqlite3CodeVerifySchema(pParse, iDb);
    notReady &= ~getMask(sWBI.pWC->pMaskSet, pTabItem->iCursor);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  notReady = ~(Bitmask)0;
  for(ii=0; ii<nTabList; ii++){
    pLevel = &pWInfo->a[ii];
    explainOneScan(pParse, pTabList, pLevel, ii, pLevel->iFrom, wctrlFlags);
    notReady = codeOneLoopStart(pWInfo, ii, wctrlFlags, notReady);
    pWInfo->iContinue = pLevel->addrCont;
  }

#ifdef SQLITE_TEST  /* For testing and debugging use only */
  /* Record in the query plan information about the current table
  ** and the index used to access it (if any).  If the table itself
  ** is not used, its name is just '{}'.  If no index is used
  ** the index is listed as "{}".  If the primary key is used the
  ** index name is '*'.
  */
  for(ii=0; ii<nTabList; ii++){
    char *z;
    int n;
    int w;
    struct SrcList_item *pTabItem;

    pLevel = &pWInfo->a[ii];
    w = pLevel->plan.wsFlags;
    pTabItem = &pTabList->a[pLevel->iFrom];
    z = pTabItem->zAlias;
    if( z==0 ) z = pTabItem->pTab->zName;
    n = sqlite3Strlen30(z);
    if( n+nQPlan < sizeof(sqlite3_query_plan)-10 ){
      if( (w & WHERE_IDX_ONLY)!=0 && (w & WHERE_COVER_SCAN)==0 ){
        memcpy(&sqlite3_query_plan[nQPlan], "{}", 2);
        nQPlan += 2;
      }else{
        memcpy(&sqlite3_query_plan[nQPlan], z, n);
        nQPlan += n;
      }
      sqlite3_query_plan[nQPlan++] = ' ';
    }
    testcase( w & WHERE_ROWID_EQ );
    testcase( w & WHERE_ROWID_RANGE );
    if( w & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      memcpy(&sqlite3_query_plan[nQPlan], "* ", 2);
      nQPlan += 2;
    }else if( (w & WHERE_INDEXED)!=0 && (w & WHERE_COVER_SCAN)==0 ){
      n = sqlite3Strlen30(pLevel->plan.u.pIdx->zName);
      if( n+nQPlan < sizeof(sqlite3_query_plan)-2 ){
        memcpy(&sqlite3_query_plan[nQPlan], pLevel->plan.u.pIdx->zName, n);
        nQPlan += n;
        sqlite3_query_plan[nQPlan++] = ' ';
      }
    }else{
      memcpy(&sqlite3_query_plan[nQPlan], "{} ", 3);
      nQPlan += 3;
    }
  }
  while( nQPlan>0 && sqlite3_query_plan[nQPlan-1]==' ' ){
    sqlite3_query_plan[--nQPlan] = 0;
  }
  sqlite3_query_plan[nQPlan] = 0;
  nQPlan = 0;
#endif /* SQLITE_TEST // Testing and debugging use only */

  /* Record the continuation address in the WhereInfo structure.  Then
  ** clean up and return.
  */
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}